

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  byte bVar1;
  _7zip *zip;
  uint64_t uVar2;
  size_t sVar3;
  lzma_ret lVar4;
  Bool BVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  uint8_t *__src;
  uint64_t uVar10;
  unsigned_long uVar11;
  ssize_t sVar12;
  ulong uVar13;
  void *pvVar14;
  byte bVar15;
  size_t sVar16;
  ulong uVar17;
  uint8_t *limit;
  size_t sVar18;
  char *pcVar19;
  long lVar20;
  size_t outSize;
  size_t sVar21;
  size_t sVar22;
  ulong uVar23;
  uchar *outBuf;
  int iVar24;
  uchar *puVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  size_t sVar31;
  bool bVar32;
  ulong local_c0;
  ulong local_78;
  ulong local_70;
  uchar *local_68;
  code *local_60;
  IByteIn *local_58;
  z_streamp local_50;
  size_t local_48;
  CPpmd7 *local_40;
  code *local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar14 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_78);
    if (0 < (long)local_78 && pvVar14 != (void *)0x0) {
      uVar10 = zip->folder_outbytes_remaining;
      uVar2 = zip->pack_stream_inbytes_remaining;
      if ((long)uVar2 <= (long)local_78) {
        local_78 = uVar2;
      }
      zip->pack_stream_inbytes_remaining = uVar2 - local_78;
      if ((long)uVar10 <= (long)local_78) {
        local_78 = uVar10;
      }
      zip->folder_outbytes_remaining = uVar10 - local_78;
      zip->uncompressed_buffer_bytes_remaining = local_78;
      return 0;
    }
    pcVar19 = "Truncated 7-Zip file body";
    iVar24 = 0x54;
LAB_0039bc82:
    archive_set_error(&a->archive,iVar24,pcVar19);
    return -0x1e;
  }
  puVar9 = zip->uncompressed_buffer;
  local_48 = minimum;
  if (puVar9 == (uchar *)0x0) {
    sVar18 = 0x10000;
    if (0x10000 < minimum) {
      sVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar18;
    puVar9 = (uchar *)malloc(sVar18);
    zip->uncompressed_buffer = puVar9;
    if (puVar9 == (uchar *)0x0) {
      pcVar19 = "No memory for 7-Zip decompression";
      iVar24 = 0xc;
      goto LAB_0039bc82;
    }
LAB_0039b369:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_0039b369;
    lVar20 = (long)zip->uncompressed_buffer_pointer - (long)puVar9;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar20 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar30 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar9 = (uchar *)realloc(puVar9,uVar30);
      if (puVar9 == (uchar *)0x0) {
        pcVar19 = "No memory for 7-Zip decompression";
        iVar24 = 0xc;
        goto LAB_0039bd41;
      }
      zip->uncompressed_buffer = puVar9;
      zip->uncompressed_buffer_size = uVar30;
    }
    if (lVar20 != 0) {
      memmove(puVar9,puVar9 + lVar20,zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_68 = zip->odd_bcj;
  local_58 = &zip->bytein;
  local_60 = Ppmd7z_RangeDec_Init;
  local_38 = Ppmd7_DecodeSymbol;
  local_40 = &zip->ppmd7_context;
  local_50 = &zip->stream;
  while (__src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_78), 0 < (long)local_78) {
    puVar9 = zip->uncompressed_buffer + zip->uncompressed_buffer_bytes_remaining;
    uVar29 = zip->uncompressed_buffer_size - zip->uncompressed_buffer_bytes_remaining;
    uVar30 = zip->pack_stream_inbytes_remaining;
    uVar17 = local_78;
    if (uVar30 <= local_78) {
      uVar17 = uVar30;
    }
    uVar11 = zip->codec2;
    sVar16 = uVar29;
    outBuf = puVar9;
    if (uVar11 != 0x3030103 || zip->codec == 0x21) {
LAB_0039b501:
      outSize = sVar16;
      puVar25 = outBuf;
      if (uVar11 == 0x303011b) {
        sVar31 = zip->tmp_stream_bytes_remaining;
        if (sVar31 != 0) {
          sVar12 = Bcj2_Decode(zip,outBuf,sVar16);
          if (sVar12 < 0) {
            pcVar19 = "BCJ2 conversion Failed";
            iVar24 = -1;
            goto LAB_0039bd41;
          }
          zip->main_stream_bytes_remaining =
               zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar31);
          outSize = sVar16 - sVar12;
          if ((uVar30 == 0) || (outSize == 0)) {
            uVar23 = uVar29 - outSize;
            lVar4 = LZMA_OK;
            if (uVar30 == 0) {
              lVar4 = (lzma_ret)(zip->tmp_stream_bytes_remaining != 0);
            }
            uVar10 = 0;
            goto LAB_0039bad9;
          }
          outBuf = outBuf + sVar12;
        }
        sVar16 = zip->tmp_stream_buff_size;
        puVar25 = zip->tmp_stream_buff;
      }
      uVar11 = zip->codec;
      if (uVar11 != 0x40202) {
        if ((uVar11 == 0x21) || (uVar11 == 0x30101)) {
          (zip->lzstream).next_in = __src;
          (zip->lzstream).avail_in = uVar17;
          (zip->lzstream).next_out = puVar25;
          (zip->lzstream).avail_out = sVar16;
          lVar4 = lzma_code(&zip->lzstream,LZMA_RUN);
          if (lVar4 != LZMA_OK) {
            if (lVar4 != LZMA_STREAM_END) {
              pcVar19 = "Decompression failed(%d)";
LAB_0039bd71:
              archive_set_error(&a->archive,-1,pcVar19,(ulong)lVar4);
              return -0x1e;
            }
            lzma_end(&zip->lzstream);
            zip->lzstream_valid = 0;
          }
          sVar31 = (zip->lzstream).avail_in;
          sVar16 = (zip->lzstream).avail_out;
        }
        else if (uVar11 == 0x30401) {
          if (((zip->ppmd7_valid == 0) || (iVar24 = zip->ppmd7_stat, iVar24 < 0)) || (sVar16 == 0))
          {
LAB_0039bd1a:
            pcVar19 = "Decompression internal error";
            goto LAB_0039bd2a;
          }
          (zip->ppstream).next_in = __src;
          (zip->ppstream).avail_in = uVar17;
          (zip->ppstream).next_out = puVar25;
          (zip->ppstream).avail_out = sVar16;
          if (iVar24 == 0) {
            (zip->bytein).a = a;
            (zip->bytein).Read = ppmd_read;
            (zip->range_dec).Stream = local_58;
            BVar5 = (*local_60)(&zip->range_dec);
            if (BVar5 == 0) {
              zip->ppmd7_stat = -1;
              pcVar19 = "Failed to initialize PPMd range decorder";
              goto LAB_0039bd2a;
            }
            if ((zip->ppstream).overconsumed != 0) {
LAB_0039bcfd:
              zip->ppmd7_stat = -1;
              return -0x1e;
            }
            zip->ppmd7_stat = 1;
          }
          if (uVar30 == 0) {
            uVar23 = zip->folder_outbytes_remaining;
          }
          else {
            uVar23 = 0;
          }
          do {
            uVar13 = uVar23;
            iVar24 = (*local_38)(local_40,&(zip->range_dec).p);
            if (iVar24 < 0) {
              zip->ppmd7_stat = -1;
              pcVar19 = "Failed to decode PPMd";
              iVar24 = 0x54;
              goto LAB_0039bd41;
            }
            if ((zip->ppstream).overconsumed != 0) goto LAB_0039bcfd;
            puVar25 = (zip->ppstream).next_out;
            (zip->ppstream).next_out = puVar25 + 1;
            *puVar25 = (uchar)iVar24;
            sVar16 = (zip->ppstream).avail_out - 1;
            (zip->ppstream).avail_out = sVar16;
            (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
            sVar31 = (zip->ppstream).avail_in;
            lVar4 = LZMA_OK;
            if (sVar16 == 0) {
              sVar16 = 0;
              break;
            }
            uVar23 = uVar13 - 1;
            if (uVar13 == 0) {
              uVar23 = 0;
            }
          } while ((sVar31 != 0) || (sVar31 = 0, 1 < uVar13));
        }
        else if (uVar11 == 0x40108) {
          (zip->stream).next_in = __src;
          (zip->stream).avail_in = (uInt)uVar17;
          (zip->stream).next_out = puVar25;
          (zip->stream).avail_out = (uInt)sVar16;
          lVar4 = cm_zlib_inflate(local_50,0);
          if (LZMA_STREAM_END < lVar4) {
            pcVar19 = "File decompression failed (%d)";
            goto LAB_0039bd71;
          }
          sVar31 = (size_t)(zip->stream).avail_in;
          sVar16 = (size_t)(zip->stream).avail_out;
        }
        else {
          if (uVar11 != 0) goto LAB_0039bd1a;
          uVar23 = sVar16;
          if (uVar17 < sVar16) {
            uVar23 = uVar17;
          }
          memcpy(puVar25,__src,uVar23);
          sVar31 = uVar17 - uVar23;
          sVar16 = sVar16 - uVar23;
          lVar4 = (lzma_ret)(uVar30 == 0);
        }
LAB_0039b73e:
        uVar23 = uVar29 - sVar16;
        if (zip->codec == 0x21) {
LAB_0039ba55:
          uVar11 = zip->codec2;
        }
        else {
          uVar11 = zip->codec2;
          if (uVar11 == 0x3030103) {
            if (uVar23 < 5) {
              sVar21 = 0;
            }
            else {
              local_c0 = (ulong)zip->bcj_prevMask;
              iVar24 = -zip->bcj_ip;
              bVar15 = -(char)zip->bcj_ip;
              sVar3 = 0;
              sVar22 = zip->bcj_prevPosT;
              while( true ) {
                sVar21 = sVar3;
                iVar8 = (int)sVar21;
                uVar6 = (uint32_t)local_c0;
                if (puVar9 + (uVar23 - 4) <= puVar9 + sVar21) break;
                if ((puVar9[sVar21] & 0xfe) == 0xe8) {
                  local_c0 = 0;
                  if (sVar21 - sVar22 < 4) {
                    uVar7 = uVar6 << (~(byte)sVar22 + (char)sVar21 & 0x1f) & 7;
                    if ((uVar7 == 0) ||
                       (((0xe8U >> uVar7 & 1) == 0 &&
                        (local_c0 = (ulong)uVar7,
                        (byte)(puVar9[sVar21 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar7))] - 1
                              ) < 0xfe)))) goto LAB_0039b8e4;
LAB_0039b9cf:
                    local_c0 = (ulong)((uVar7 & 3) * 2 + 1);
                    lVar20 = 1;
                  }
                  else {
LAB_0039b8e4:
                    bVar1 = puVar9[sVar21 + 4];
                    uVar7 = (uint)local_c0;
                    if ((bVar1 != 0xff) && (bVar1 != 0)) goto LAB_0039b9cf;
                    uVar26 = (uint)puVar9[sVar21 + 1] |
                             (uint)puVar9[sVar21 + 2] << 8 |
                             (uint)puVar9[sVar21 + 3] << 0x10 | (uint)bVar1 << 0x18;
                    while (uVar7 != 0) {
                      uVar28 = uVar26 + (iVar24 - iVar8);
                      uVar27 = uVar28 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber + local_c0)
                                          * -8 + 0x18U & 0x1f);
                      if (((char)uVar27 != -1) && ((uVar27 & 0xff) != 0)) break;
                      uVar26 = ~(uVar28 ^ -1 << (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                          local_c0) * -8 & 0x1fU));
                    }
                    iVar8 = (iVar24 + uVar26) - iVar8;
                    puVar9[sVar21 + 4] = (uchar)(iVar8 * 0x80 >> 0x1f);
                    puVar9[sVar21 + 3] = (uchar)((uint)iVar8 >> 0x10);
                    puVar9[sVar21 + 2] = (uchar)((uint)iVar8 >> 8);
                    puVar9[sVar21 + 1] = ((char)uVar26 + bVar15) - (char)sVar21;
                    lVar20 = 5;
                    local_70 = (ulong)bVar15;
                  }
                  sVar3 = lVar20 + sVar21;
                  sVar22 = sVar21;
                }
                else {
                  sVar3 = sVar21 + 1;
                }
              }
              zip->bcj_prevPosT = sVar22;
              zip->bcj_prevMask = uVar6;
              zip->bcj_ip = zip->bcj_ip + iVar8;
            }
            sVar18 = uVar23 - sVar21;
            zip->odd_bcj_size = sVar18;
            if ((((sVar18 == 0) || (lVar4 == LZMA_STREAM_END)) || (4 < sVar18)) || (uVar30 == 0)) {
              zip->odd_bcj_size = 0;
            }
            else {
              memcpy(local_68,puVar9 + sVar21,sVar18);
              uVar23 = sVar21;
            }
            goto LAB_0039ba55;
          }
        }
        if (uVar11 == 0x303011b) {
          uVar30 = zip->tmp_stream_buff_size - sVar16;
          if (zip->main_stream_bytes_remaining <= uVar30) {
            uVar30 = zip->main_stream_bytes_remaining;
          }
          zip->tmp_stream_bytes_avail = uVar30;
          zip->tmp_stream_bytes_remaining = uVar30;
          sVar12 = Bcj2_Decode(zip,outBuf,outSize);
          if (sVar12 < 0) {
            pcVar19 = "BCJ2 conversion Failed";
            goto LAB_0039bd2a;
          }
          zip->main_stream_bytes_remaining =
               zip->main_stream_bytes_remaining +
               (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
          uVar23 = (uVar29 - outSize) + sVar12;
        }
        if (LZMA_STREAM_END < lVar4) {
          return -0x1e;
        }
        uVar10 = uVar17 - sVar31;
        goto LAB_0039bad9;
      }
      (zip->bzstream).next_in = (char *)__src;
      (zip->bzstream).avail_in = (uInt)uVar17;
      (zip->bzstream).next_out = (char *)puVar25;
      (zip->bzstream).avail_out = (uInt)sVar16;
      lVar4 = BZ2_bzDecompress(&zip->bzstream);
      if (lVar4 == LZMA_OK) {
LAB_0039b730:
        sVar31 = (size_t)(zip->bzstream).avail_in;
        sVar16 = (size_t)(zip->bzstream).avail_out;
        goto LAB_0039b73e;
      }
      if (lVar4 == LZMA_GET_CHECK) {
        iVar24 = BZ2_bzDecompressEnd(&zip->bzstream);
        if (iVar24 == 0) {
          zip->bzstream_valid = 0;
          lVar4 = LZMA_STREAM_END;
          goto LAB_0039b730;
        }
        pcVar19 = "Failed to clean up decompressor";
      }
      else {
        pcVar19 = "bzip decompression failed";
      }
LAB_0039bd2a:
      iVar24 = -1;
      goto LAB_0039bd41;
    }
    sVar16 = zip->odd_bcj_size;
    if (uVar29 < 5 && uVar30 != 0) {
      lVar4 = LZMA_OK;
      uVar23 = 0;
      uVar10 = 0;
      bVar32 = sVar16 == 0;
      sVar16 = 0;
      if (bVar32) goto LAB_0039b4a6;
    }
    else {
LAB_0039b4a6:
      for (uVar23 = 0; (sVar16 != 0 && (uVar29 != uVar23)); uVar23 = uVar23 + 1) {
        puVar9[uVar23] = zip->odd_bcj[uVar23];
        sVar16 = zip->odd_bcj_size - 1;
        zip->odd_bcj_size = sVar16;
      }
      sVar16 = uVar29 - uVar23;
      if (sVar16 != 0 && uVar30 != 0) {
        outBuf = puVar9 + uVar23;
        uVar11 = zip->codec2;
        goto LAB_0039b501;
      }
      lVar4 = (lzma_ret)(uVar30 == 0);
      uVar10 = 0;
    }
LAB_0039bad9:
    uVar2 = zip->pack_stream_inbytes_remaining;
    zip->pack_stream_inbytes_remaining = uVar2 - uVar10;
    uVar30 = zip->folder_outbytes_remaining;
    uVar17 = uVar30;
    if (uVar23 < uVar30) {
      uVar17 = uVar23;
    }
    zip->folder_outbytes_remaining = uVar30 - uVar17;
    uVar29 = zip->uncompressed_buffer_bytes_remaining + uVar17;
    zip->uncompressed_buffer_bytes_remaining = uVar29;
    zip->pack_stream_bytes_unconsumed = uVar10;
    if ((uVar29 == zip->uncompressed_buffer_size) ||
       ((((zip->codec2 == 0x3030103 && (zip->uncompressed_buffer_size < uVar29 + 5)) &&
         (zip->odd_bcj_size != 0)) || ((uVar2 == uVar10 && (uVar30 <= uVar23)))))) {
      if (local_48 <= uVar29) {
        zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
        return 0;
      }
      pcVar19 = "Damaged 7-Zip archive";
      iVar24 = -1;
      goto LAB_0039bc82;
    }
    if ((lVar4 != LZMA_OK) || (uVar17 == 0 && uVar10 == 0)) {
      pcVar19 = "Damaged 7-Zip archive";
      goto LAB_0039bd2a;
    }
    read_consume(a);
  }
  pcVar19 = "Truncated 7-Zip file body";
  iVar24 = 0x54;
LAB_0039bd41:
  archive_set_error(&a->archive,iVar24,pcVar19);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}